

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::loadPLY(SceneGraph *this,FileName *fileName)

{
  PlyParser PStack_278;
  
  PlyParser::PlyParser(&PStack_278,fileName);
  *(Node **)this = PStack_278.scene.ptr;
  PStack_278.scene.ptr = (Node *)0x0;
  PlyParser::~PlyParser(&PStack_278);
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<Node> loadPLY(const FileName& fileName) {
      return PlyParser(fileName).scene;
    }